

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> * __thiscall
Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator=
          (OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *this,
          OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *other)

{
  bool bVar1;
  Value local_18;
  
  if (this->_isSome == true) {
    VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
              ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)&this->_elem);
  }
  bVar1 = other->_isSome;
  if (bVar1 == true) {
    local_18 = (other->_elem)._elem;
    if (local_18 != (Value)0x0) {
      *(int *)((long)local_18 + 8) = *(int *)((long)local_18 + 8) + 2;
    }
    (this->_elem)._elem = local_18;
    VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator(&local_18.init)
    ;
    bVar1 = other->_isSome;
  }
  this->_isSome = bVar1;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }